

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O3

void __thiscall myvk::Instance::~Instance(Instance *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  VkInstance pVVar4;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Instance_0032c438;
  pVVar4 = this->m_instance;
  if (pVVar4 != (VkInstance)0x0) {
    if (this->m_debug_messenger != (VkDebugUtilsMessengerEXT)0x0) {
      (*vkDestroyDebugUtilsMessengerEXT)
                (pVVar4,this->m_debug_messenger,(VkAllocationCallbacks *)0x0);
      pVVar4 = this->m_instance;
    }
    (*vkDestroyInstance)(pVVar4,(VkAllocationCallbacks *)0x0);
  }
  p_Var2 = (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
           super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Instance::~Instance() {
	if (m_instance) {
		if (m_debug_messenger)
			vkDestroyDebugUtilsMessengerEXT(m_instance, m_debug_messenger, nullptr);
		vkDestroyInstance(m_instance, nullptr);
	}
}